

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O2

bool __thiscall
absl::lts_20250127::time_internal::cctz::anon_unknown_0::Header::Build(Header *this,tzhead *tzh)

{
  size_t sVar1;
  
  sVar1 = Decode32(tzh->tzh_timecnt);
  if (-1 < (long)sVar1) {
    this->timecnt = sVar1;
    sVar1 = Decode32(tzh->tzh_typecnt);
    if (-1 < (long)sVar1) {
      this->typecnt = sVar1;
      sVar1 = Decode32(tzh->tzh_charcnt);
      if (-1 < (long)sVar1) {
        this->charcnt = sVar1;
        sVar1 = Decode32(tzh->tzh_leapcnt);
        if (-1 < (long)sVar1) {
          this->leapcnt = sVar1;
          sVar1 = Decode32(tzh->tzh_ttisstdcnt);
          if (-1 < (long)sVar1) {
            this->ttisstdcnt = sVar1;
            sVar1 = Decode32(tzh->tzh_ttisutcnt);
            if (-1 < (long)sVar1) {
              this->ttisutcnt = sVar1;
              return true;
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool Header::Build(const tzhead& tzh) {
  std::int_fast32_t v;
  if ((v = Decode32(tzh.tzh_timecnt)) < 0) return false;
  timecnt = static_cast<std::size_t>(v);
  if ((v = Decode32(tzh.tzh_typecnt)) < 0) return false;
  typecnt = static_cast<std::size_t>(v);
  if ((v = Decode32(tzh.tzh_charcnt)) < 0) return false;
  charcnt = static_cast<std::size_t>(v);
  if ((v = Decode32(tzh.tzh_leapcnt)) < 0) return false;
  leapcnt = static_cast<std::size_t>(v);
  if ((v = Decode32(tzh.tzh_ttisstdcnt)) < 0) return false;
  ttisstdcnt = static_cast<std::size_t>(v);
  if ((v = Decode32(tzh.tzh_ttisutcnt)) < 0) return false;
  ttisutcnt = static_cast<std::size_t>(v);
  return true;
}